

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::connection::connection(connection *this,service *srv)

{
  undefined8 in_RSI;
  noncopyable *in_RDI;
  size_t in_stack_ffffffffffffffb8;
  string_map *in_stack_ffffffffffffffc0;
  
  booster::noncopyable::noncopyable(in_RDI);
  std::enable_shared_from_this<cppcms::impl::cgi::connection>::enable_shared_from_this
            ((enable_shared_from_this<cppcms::impl::cgi::connection> *)0x37eebb);
  *(undefined ***)in_RDI = &PTR__connection_0052a848;
  string_pool::string_pool((string_pool *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  string_map::string_map(in_stack_ffffffffffffffc0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x37ef0a);
  *(undefined8 *)(in_RDI + 0x78) = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 0x80));
  std::__cxx11::string::string((string *)(in_RDI + 0xa0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x37ef52);
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)(in_RDI + 0xf0));
  in_RDI[0xf8] = (noncopyable)0x0;
  return;
}

Assistant:

connection::connection(cppcms::service &srv) :
	service_(&srv),
    error_state_(false)
{
}